

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

HighsStatus reportIpxSolveStatus(HighsOptions *options,Int solve_status,Int error_flag)

{
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  HighsStatus local_4;
  
  if (in_ESI == 1000) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kInfo,"Ipx: Solved\n");
    local_4 = kOk;
  }
  else if (in_ESI == 0x3ed) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kWarning,"Ipx: Stopped\n");
    local_4 = kWarning;
  }
  else {
    if (in_ESI == 0x3ee) {
      if (in_EDX == 0x66) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,
                     "Ipx: Invalid input - argument_null\n");
      }
      else if (in_EDX == 0x67) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,
                     "Ipx: Invalid input - invalid dimension\n");
      }
      else if (in_EDX == 0x68) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,
                     "Ipx: Invalid input - invalid matrix\n");
      }
      else if (in_EDX == 0x69) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,
                     "Ipx: Invalid input - invalid vector\n");
      }
      else if (in_EDX == 0x6b) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,
                     "Ipx: Invalid input - invalid basis\n");
      }
      else {
        highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,
                     "Ipx: Invalid input - unrecognised error\n");
      }
    }
    else if (in_ESI == 0x3eb) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,"Ipx: Out of memory\n");
    }
    else if (in_ESI == 0x3ec) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,"Ipx: Internal error %d\n",
                   (ulong)in_EDX);
    }
    else {
      highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,
                   "Ipx: unrecognised solve status = %d\n",(ulong)in_ESI);
    }
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus reportIpxSolveStatus(const HighsOptions& options,
                                 const ipx::Int solve_status,
                                 const ipx::Int error_flag) {
  if (solve_status == IPX_STATUS_solved) {
    highsLogUser(options.log_options, HighsLogType::kInfo, "Ipx: Solved\n");
    return HighsStatus::kOk;
  } else if (solve_status == IPX_STATUS_stopped) {
    highsLogUser(options.log_options, HighsLogType::kWarning, "Ipx: Stopped\n");
    return HighsStatus::kWarning;
    // Remaining cases are errors so drop through to return HighsStatus::kError;
  } else if (solve_status == IPX_STATUS_no_model) {
    if (error_flag == IPX_ERROR_argument_null) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - argument_null\n");
    } else if (error_flag == IPX_ERROR_invalid_dimension) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid dimension\n");
    } else if (error_flag == IPX_ERROR_invalid_matrix) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid matrix\n");
    } else if (error_flag == IPX_ERROR_invalid_vector) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid vector\n");
    } else if (error_flag == IPX_ERROR_invalid_basis) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid basis\n");
    } else {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - unrecognised error\n");
    }
  } else if (solve_status == IPX_STATUS_out_of_memory) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: Out of memory\n");
  } else if (solve_status == IPX_STATUS_internal_error) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: Internal error %" HIGHSINT_FORMAT "\n", (int)error_flag);
  } else {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: unrecognised solve status = %" HIGHSINT_FORMAT "\n",
                 (int)solve_status);
  }
  return HighsStatus::kError;
}